

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void inter_modes_info_push
               (InterModesInfo *inter_modes_info,int mode_rate,int64_t sse,int64_t rd,
               RD_STATS *rd_cost,RD_STATS *rd_cost_y,RD_STATS *rd_cost_uv,MB_MODE_INFO *mbmi)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int *in_RDI;
  void *in_R8;
  void *in_R9;
  int num;
  
  iVar1 = *in_RDI;
  memcpy(in_RDI + (long)iVar1 * 0x2c + 2,rd_cost,0xb0);
  in_RDI[(long)iVar1 + 0xb002] = in_ESI;
  *(undefined8 *)(in_RDI + (long)iVar1 * 2 + 0xb402) = in_RDX;
  *(undefined8 *)(in_RDI + (long)iVar1 * 2 + 0xbc02) = in_RCX;
  memcpy(in_RDI + (long)iVar1 * 10 + 0xd402,in_R8,0x28);
  memcpy(in_RDI + (long)iVar1 * 10 + 0xfc02,in_R9,0x28);
  memcpy(in_RDI + (long)iVar1 * 10 + 0x12402,rd_cost_y,0x28);
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

static inline void inter_modes_info_push(InterModesInfo *inter_modes_info,
                                         int mode_rate, int64_t sse, int64_t rd,
                                         RD_STATS *rd_cost, RD_STATS *rd_cost_y,
                                         RD_STATS *rd_cost_uv,
                                         const MB_MODE_INFO *mbmi) {
  const int num = inter_modes_info->num;
  assert(num < MAX_INTER_MODES);
  inter_modes_info->mbmi_arr[num] = *mbmi;
  inter_modes_info->mode_rate_arr[num] = mode_rate;
  inter_modes_info->sse_arr[num] = sse;
  inter_modes_info->est_rd_arr[num] = rd;
  inter_modes_info->rd_cost_arr[num] = *rd_cost;
  inter_modes_info->rd_cost_y_arr[num] = *rd_cost_y;
  inter_modes_info->rd_cost_uv_arr[num] = *rd_cost_uv;
  ++inter_modes_info->num;
}